

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

undefined8 Catch::toString(wstring *value)

{
  ulong uVar1;
  int *piVar2;
  undefined4 *puVar3;
  ulong in_RSI;
  undefined8 in_RDI;
  size_t i;
  string s;
  string *in_stack_000000c8;
  char local_69;
  ulong local_48;
  string local_30 [32];
  ulong local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_30);
  std::__cxx11::wstring::size();
  std::__cxx11::string::reserve((ulong)local_30);
  local_48 = 0;
  while( true ) {
    uVar1 = std::__cxx11::wstring::size();
    if (uVar1 <= local_48) break;
    piVar2 = (int *)std::__cxx11::wstring::operator[](local_10);
    if (*piVar2 < 0x100) {
      puVar3 = (undefined4 *)std::__cxx11::wstring::operator[](local_10);
      local_69 = (char)*puVar3;
    }
    else {
      local_69 = '?';
    }
    std::__cxx11::string::operator+=(local_30,local_69);
    local_48 = local_48 + 1;
  }
  toString(in_stack_000000c8);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

std::string toString( std::wstring const& value ) {

    std::string s;
    s.reserve( value.size() );
    for(size_t i = 0; i < value.size(); ++i )
        s += value[i] <= 0xff ? static_cast<char>( value[i] ) : '?';
    return toString( s );
}